

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jit_compiler_x86.cpp
# Opt level: O3

void __thiscall randomx::JitCompilerX86::h_CBRANCH(JitCompilerX86 *this,Instruction *instr,int i)

{
  byte bVar1;
  uint8_t *puVar2;
  uint8_t uVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  
  bVar1 = instr->dst;
  iVar6 = this->codePos;
  iVar4 = ((this->instructionOffsets).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start[(long)this->registerUsage[bVar1] + 1] - iVar6) + -0x10;
  if ((BranchesWithin32B == '\x01') &&
     (0x1f < (iVar6 + (uint)(iVar4 < -0x80) * 4 + 0x10 ^ iVar6 + 7U))) {
    uVar5 = 0x20 - (iVar6 + 7U & 0x1f);
    iVar4 = iVar4 - uVar5;
    memcpy(this->code + iVar6,&JMP_ALIGN_PREFIX + uVar5 * 0x10,(ulong)uVar5);
    iVar6 = uVar5 + this->codePos;
    this->codePos = iVar6;
  }
  puVar2 = this->code;
  (puVar2 + iVar6)[0] = 'I';
  (puVar2 + iVar6)[1] = 0x81;
  iVar6 = this->codePos + 2;
  this->codePos = iVar6;
  uVar3 = bVar1 - 0x40;
  this->code[iVar6] = uVar3;
  iVar6 = this->codePos;
  this->codePos = iVar6 + 1;
  bVar1 = instr->mod >> 4;
  *(uint32_t *)(this->code + (long)iVar6 + 1) = ~(0x80 << bVar1) & (0x100 << bVar1 | instr->imm32);
  iVar6 = this->codePos + 4;
  this->codePos = iVar6;
  puVar2 = this->code;
  (puVar2 + iVar6)[0] = 'I';
  (puVar2 + iVar6)[1] = 0xf7;
  iVar6 = this->codePos + 2;
  this->codePos = iVar6;
  this->code[iVar6] = uVar3;
  iVar6 = this->codePos;
  this->codePos = iVar6 + 1;
  *(int *)(this->code + (long)iVar6 + 1) = 0xff00 << bVar1;
  iVar6 = this->codePos + 4;
  this->codePos = iVar6;
  if (iVar4 < -0x80) {
    puVar2 = this->code + iVar6;
    puVar2[0] = '\x0f';
    puVar2[1] = 0x84;
    iVar6 = this->codePos + 2;
    this->codePos = iVar6;
    *(int *)(this->code + iVar6) = iVar4 + -4;
    iVar6 = 4;
  }
  else {
    this->code[iVar6] = 't';
    iVar6 = this->codePos;
    this->codePos = iVar6 + 1;
    this->code[(long)iVar6 + 1] = (uint8_t)iVar4;
    iVar6 = 1;
  }
  this->codePos = this->codePos + iVar6;
  this->registerUsage[0] = i;
  this->registerUsage[1] = i;
  this->registerUsage[2] = i;
  this->registerUsage[3] = i;
  this->registerUsage[4] = i;
  this->registerUsage[5] = i;
  this->registerUsage[6] = i;
  this->registerUsage[7] = i;
  return;
}

Assistant:

void JitCompilerX86::h_CBRANCH(Instruction& instr, int i) {
		int reg = instr.dst;
		int target = registerUsage[reg] + 1;

		int32_t jmp_offset = instructionOffsets[target] - (codePos + 16);

		if (BranchesWithin32B) {
			const uint32_t branch_begin = static_cast<uint32_t>(codePos + 7);
			const uint32_t branch_end = static_cast<uint32_t>(branch_begin + ((jmp_offset >= -128) ? 9 : 13));

			// If the jump crosses or touches 32-byte boundary, align it
			if ((branch_begin ^ branch_end) >= 32) {
				const uint32_t alignment_size = 32 - (branch_begin & 31);
				jmp_offset -= alignment_size;
				emit(JMP_ALIGN_PREFIX[alignment_size], alignment_size);
			}
		}

		emit(REX_ADD_I);
		emitByte(0xc0 + reg);
		const int shift = instr.getModCond() + ConditionOffset;
		uint32_t imm = instr.getImm32() | (1UL << shift);
		if (ConditionOffset > 0 || shift > 0)
			imm &= ~(1UL << (shift - 1));
		emit32(imm);

		emit(REX_TEST);
		emitByte(0xc0 + reg);
		emit32(ConditionMask << shift);

		if (jmp_offset >= -128) {
			emitByte(JZ_SHORT);
			emitByte(jmp_offset);
		}
		else {
			emit(JZ);
			emit32(jmp_offset - 4);
		}

		//mark all registers as used
		for (unsigned j = 0; j < RegistersCount; ++j) {
			registerUsage[j] = i;
		}
	}